

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

string * __thiscall
cmLocalUnixMakefileGenerator3::ConvertToFullPath
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *localPath)

{
  string *psVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_78 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  size_type local_28;
  pointer local_20;
  undefined8 local_18;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_58.first._M_str = (psVar1->_M_dataplus)._M_p;
  local_58.first._M_len = psVar1->_M_string_length;
  local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38 = local_78;
  local_78[0] = 0x2f;
  local_40 = 1;
  local_30 = 0;
  local_20 = (localPath->_M_dataplus)._M_p;
  local_28 = localPath->_M_string_length;
  local_18 = 0;
  views._M_len = 3;
  views._M_array = &local_58;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::ConvertToFullPath(
  const std::string& localPath)
{
  std::string dir =
    cmStrCat(this->GetCurrentBinaryDirectory(), '/', localPath);
  return dir;
}